

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O3

int32_t ucurr_countCurrencies_63(char *locale,UDate date,UErrorCode *ec)

{
  int32_t iVar1;
  UErrorCode UVar2;
  char *pcVar3;
  UResourceBundle *pUVar4;
  UResourceBundle *pUVar5;
  UResourceBundle *resB;
  int32_t *piVar6;
  UErrorCode *ec_00;
  int indexR;
  int32_t iVar7;
  UErrorCode localStatus;
  int32_t toLength;
  int32_t fromLength;
  char id [157];
  UErrorCode local_104;
  int32_t local_100 [2];
  UDate local_f8;
  double local_f0;
  UErrorCode *local_e8;
  UResourceBundle *local_e0;
  char local_d8 [168];
  
  if ((ec != (UErrorCode *)0x0) && (*ec < U_ILLEGAL_ARGUMENT_ERROR)) {
    local_104 = U_ZERO_ERROR;
    ec_00 = (UErrorCode *)0x9d;
    local_f8 = date;
    uloc_getKeywordValue_63(locale,"currency",local_d8,0x9d,&local_104);
    idForLocale(locale,local_d8,(int)ec,ec_00);
    if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
      pcVar3 = strchr(local_d8,0x5f);
      if (pcVar3 != (char *)0x0) {
        *pcVar3 = '\0';
      }
      local_e8 = ec;
      pUVar4 = ures_openDirect_63("icudt63l-curr","supplementalData",&local_104);
      pUVar5 = ures_getByKey_63(pUVar4,"CurrencyMap",pUVar4,&local_104);
      pUVar4 = ures_getByKey_63(pUVar4,local_d8,pUVar5,&local_104);
      iVar7 = 0;
      if ((local_104 < U_ILLEGAL_ARGUMENT_ERROR) &&
         (iVar1 = ures_getSize_63(pUVar4), iVar7 = 0, 0 < iVar1)) {
        iVar7 = 0;
        indexR = 0;
        local_e0 = pUVar4;
        do {
          pUVar5 = ures_getByIndex_63(pUVar4,indexR,(UResourceBundle *)0x0,&local_104);
          local_100[1] = 0;
          resB = ures_getByKey_63(pUVar5,"from",(UResourceBundle *)0x0,&local_104);
          piVar6 = ures_getIntVector_63(resB,local_100 + 1,&local_104);
          local_f0 = (double)CONCAT44(*piVar6,piVar6[1]);
          iVar1 = ures_getSize_63(pUVar5);
          if (iVar1 < 3) {
            if (local_f0 <= local_f8) {
              iVar7 = iVar7 + 1;
            }
          }
          else {
            local_100[0] = 0;
            pUVar4 = ures_getByKey_63(pUVar5,"to",(UResourceBundle *)0x0,&local_104);
            piVar6 = ures_getIntVector_63(pUVar4,local_100,&local_104);
            if ((local_f0 <= local_f8) && (local_f8 < (double)CONCAT44(*piVar6,piVar6[1]))) {
              iVar7 = iVar7 + 1;
            }
            ures_close_63(pUVar4);
            pUVar4 = local_e0;
          }
          ures_close_63(pUVar5);
          ures_close_63(resB);
          indexR = indexR + 1;
          iVar1 = ures_getSize_63(pUVar4);
        } while (indexR < iVar1);
      }
      ures_close_63(pUVar4);
      UVar2 = *local_e8;
      if (local_104 != U_ZERO_ERROR || *local_e8 == U_ZERO_ERROR) {
        *local_e8 = local_104;
        UVar2 = local_104;
      }
      if (UVar2 < U_ILLEGAL_ARGUMENT_ERROR) {
        return iVar7;
      }
    }
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucurr_countCurrencies(const char* locale, 
                 UDate date, 
                 UErrorCode* ec)
{
    int32_t currCount = 0;

    if (ec != NULL && U_SUCCESS(*ec)) 
    {
        // local variables
        UErrorCode localStatus = U_ZERO_ERROR;
        char id[ULOC_FULLNAME_CAPACITY];
        uloc_getKeywordValue(locale, "currency", id, ULOC_FULLNAME_CAPACITY, &localStatus);

        // get country or country_variant in `id'
        /*uint32_t variantType =*/ idForLocale(locale, id, sizeof(id), ec);

        if (U_FAILURE(*ec))
        {
            return 0;
        }

        // Remove variants, which is only needed for registration.
        char *idDelim = strchr(id, VAR_DELIM);
        if (idDelim)
        {
            idDelim[0] = 0;
        }

        // Look up the CurrencyMap element in the root bundle.
        UResourceBundle *rb = ures_openDirect(U_ICUDATA_CURR, CURRENCY_DATA, &localStatus);
        UResourceBundle *cm = ures_getByKey(rb, CURRENCY_MAP, rb, &localStatus);

        // Using the id derived from the local, get the currency data
        UResourceBundle *countryArray = ures_getByKey(rb, id, cm, &localStatus);

        // process each currency to see which one is valid for the given date
        if (U_SUCCESS(localStatus))
        {
            for (int32_t i=0; i<ures_getSize(countryArray); i++)
            {
                // get the currency resource
                UResourceBundle *currencyRes = ures_getByIndex(countryArray, i, NULL, &localStatus);

                // get the from date
                int32_t fromLength = 0;
                UResourceBundle *fromRes = ures_getByKey(currencyRes, "from", NULL, &localStatus);
                const int32_t *fromArray = ures_getIntVector(fromRes, &fromLength, &localStatus);

                int64_t currDate64 = (int64_t)fromArray[0] << 32;
                currDate64 |= ((int64_t)fromArray[1] & (int64_t)INT64_C(0x00000000FFFFFFFF));
                UDate fromDate = (UDate)currDate64;

                if (ures_getSize(currencyRes)> 2)
                {
                    int32_t toLength = 0;
                    UResourceBundle *toRes = ures_getByKey(currencyRes, "to", NULL, &localStatus);
                    const int32_t *toArray = ures_getIntVector(toRes, &toLength, &localStatus);

                    currDate64 = (int64_t)toArray[0] << 32;
                    currDate64 |= ((int64_t)toArray[1] & (int64_t)INT64_C(0x00000000FFFFFFFF));
                    UDate toDate = (UDate)currDate64;

                    if ((fromDate <= date) && (date < toDate))
                    {
                        currCount++;
                    }

                    ures_close(toRes);
                }
                else
                {
                    if (fromDate <= date)
                    {
                        currCount++;
                    }
                }

                // close open resources
                ures_close(currencyRes);
                ures_close(fromRes);

            } // end For loop
        } // end if (U_SUCCESS(localStatus))

        ures_close(countryArray);

        // Check for errors
        if (*ec == U_ZERO_ERROR || localStatus != U_ZERO_ERROR)
        {
            // There is nothing to fallback to. 
            // Report the failure/warning if possible.
            *ec = localStatus;
        }

        if (U_SUCCESS(*ec))
        {
            // no errors
            return currCount;
        }

    }

    // If we got here, either error code is invalid or
    // some argument passed is no good.
    return 0;
}